

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2max_distance_targets.cc
# Opt level: O2

S2Cap * __thiscall
S2MaxDistanceShapeIndexTarget::GetCapBound
          (S2Cap *__return_storage_ptr__,S2MaxDistanceShapeIndexTarget *this)

{
  S2Cap cap;
  undefined1 local_68 [24];
  Iterator local_50;
  S2Cap local_38;
  
  S2ShapeIndexRegion<S2ShapeIndex>::S2ShapeIndexRegion
            ((S2ShapeIndexRegion<S2ShapeIndex> *)local_68,this->index_);
  S2ShapeIndexRegion<S2ShapeIndex>::GetCapBound
            (&local_38,(S2ShapeIndexRegion<S2ShapeIndex> *)local_68);
  if (local_50.iter_._M_t.
      super___uniq_ptr_impl<S2ShapeIndex::IteratorBase,_std::default_delete<S2ShapeIndex::IteratorBase>_>
      ._M_t.
      super__Tuple_impl<0UL,_S2ShapeIndex::IteratorBase_*,_std::default_delete<S2ShapeIndex::IteratorBase>_>
      .super__Head_base<0UL,_S2ShapeIndex::IteratorBase_*,_false>._M_head_impl !=
      (__uniq_ptr_data<S2ShapeIndex::IteratorBase,_std::default_delete<S2ShapeIndex::IteratorBase>,_true,_true>
       )0x0) {
    (**(code **)(*(long *)local_50.iter_._M_t.
                          super___uniq_ptr_impl<S2ShapeIndex::IteratorBase,_std::default_delete<S2ShapeIndex::IteratorBase>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_S2ShapeIndex::IteratorBase_*,_std::default_delete<S2ShapeIndex::IteratorBase>_>
                          .super__Head_base<0UL,_S2ShapeIndex::IteratorBase_*,_false>._M_head_impl +
                8))();
  }
  local_68._16_8_ = -local_38.center_.c_[2];
  local_68._4_4_ = local_38.center_.c_[0]._4_4_ ^ 0x80000000;
  local_68._12_4_ = local_38.center_.c_[1]._4_4_ ^ 0x80000000;
  local_68._0_4_ = local_38.center_.c_[0]._0_4_;
  local_68._8_4_ = local_38.center_.c_[1]._0_4_;
  S2Cap::S2Cap(__return_storage_ptr__,(S2Point *)local_68,local_38.radius_);
  return __return_storage_ptr__;
}

Assistant:

S2Cap S2MaxDistanceShapeIndexTarget::GetCapBound() {
  S2Cap cap = MakeS2ShapeIndexRegion(index_).GetCapBound();
  return S2Cap(-cap.center(), cap.radius());
}